

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O3

void __thiscall
TPZReducedSpace::ComputeRequiredData
          (TPZReducedSpace *this,TPZMaterialDataT<double> *data,TPZVec<double> *qsi)

{
  TPZFNMatrix<9,_double> *axes;
  TPZGeoEl *pTVar1;
  TPZManVector<double,_3> *this_00;
  double dVar2;
  double local_28;
  
  (data->super_TPZMaterialData).intGlobPtIndex = -1;
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar1 + 0x210))(pTVar1);
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  axes = &(data->super_TPZMaterialData).axes;
  TPZGeoEl::Jacobian(pTVar1,qsi,&(data->super_TPZMaterialData).jacobian.super_TPZFMatrix<double>,
                     &axes->super_TPZFMatrix<double>,&(data->super_TPZMaterialData).detjac,
                     &(data->super_TPZMaterialData).jacinv.super_TPZFMatrix<double>);
  (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x310))
            (this,qsi,&(data->super_TPZMaterialData).phi,&(data->super_TPZMaterialData).dphix,axes);
  if ((data->super_TPZMaterialData).fNeedsSol == true) {
    (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x300))(this,data);
  }
  if ((data->super_TPZMaterialData).fNeedsHSize == true) {
    dVar2 = (double)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x2d0))(this);
    (data->super_TPZMaterialData).HSize = dVar2 + dVar2;
  }
  if ((data->super_TPZMaterialData).fNeedsNormal == true) {
    (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x2c0))(this,data);
  }
  this_00 = &(data->super_TPZMaterialData).x;
  local_28 = 0.0;
  TPZManVector<double,_3>::Resize(this_00,3,&local_28);
  pTVar1 = TPZCompEl::Reference((TPZCompEl *)this);
  (**(code **)(*(long *)pTVar1 + 0x228))(pTVar1,qsi,this_00);
  return;
}

Assistant:

void TPZReducedSpace::ComputeRequiredData(TPZMaterialDataT<STATE> &data,
                                 TPZVec<REAL> &qsi)
{
    data.intGlobPtIndex = -1;
    int dim = Reference()->Dimension();
    Reference()->Jacobian(qsi, data.jacobian, data.axes, data.detjac, data.jacinv);
    ShapeX(qsi, data.phi, data.dphix, data.axes);

    if (data.fNeedsSol) {
        ReallyComputeSolution(data);
    }
    if (data.fNeedsHSize){
		data.HSize = 2.*this->InnerRadius();
	}//fNeedHSize
    
    if(data.fNeedsNormal){
        this->ComputeNormal(data);
    }
    data.x.Resize(3., 0.);
    Reference()->X(qsi, data.x);
    
}